

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

void __thiscall cmSourceFile::cmSourceFile(cmSourceFile *this,cmMakefile *mf,string *name)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  string local_50;
  
  cmSourceFileLocation::cmSourceFileLocation(&this->Location,mf,name);
  p_Var1 = &(this->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->CustomCommand = (cmCustomCommand *)0x0;
  (this->Extension)._M_dataplus._M_p = (pointer)&(this->Extension).field_2;
  (this->Extension)._M_string_length = 0;
  (this->Extension).field_2._M_local_buf[0] = '\0';
  (this->Language)._M_dataplus._M_p = (pointer)&(this->Language).field_2;
  (this->Language)._M_string_length = 0;
  (this->Language).field_2._M_local_buf[0] = '\0';
  (this->FullPath)._M_dataplus._M_p = (pointer)&(this->FullPath).field_2;
  (this->FullPath)._M_string_length = 0;
  (this->FullPath).field_2._M_local_buf[0] = '\0';
  (this->ObjectLibrary)._M_dataplus._M_p = (pointer)&(this->ObjectLibrary).field_2;
  (this->ObjectLibrary)._M_string_length = 0;
  (this->ObjectLibrary).field_2._M_local_buf[0] = '\0';
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Depends).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->Depends).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  cmsys::SystemTools::GetFilenameLastExtension(&local_50,&(this->Location).Name);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  this->IsUiFile = iVar2 == 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmSourceFile::cmSourceFile(cmMakefile* mf, const std::string& name):
  Location(mf, name)
{
  this->CustomCommand = 0;
  this->FindFullPathFailed = false;
  this->IsUiFile = (".ui" ==
          cmSystemTools::GetFilenameLastExtension(this->Location.GetName()));
}